

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

void getaddrinfo_cb(uv_getaddrinfo_t *req,int status,addrinfo *res)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (status == -0xbbb) {
    if (res == (addrinfo *)0x0) {
      uv_freeaddrinfo(0);
      return;
    }
    pcVar1 = "res == NULL";
    uStack_10 = 0x65;
  }
  else {
    pcVar1 = "status == UV_EAI_CANCELED";
    uStack_10 = 100;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void getaddrinfo_cb(uv_getaddrinfo_t* handle,
                           int status,
                           struct addrinfo* res) {
  struct getaddrinfo_req* req;

  ASSERT(status == 0);

  req = container_of(handle, struct getaddrinfo_req, handle);
  uv_freeaddrinfo(res);

  if (--req->counter)
    getaddrinfo_do(req);
}